

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# img2webp.c
# Opt level: O3

int main(int argc,char **argv)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  WebPMuxError WVar6;
  WebPImageReader p_Var7;
  WebPAnimEncoder *pWVar8;
  WebPMux *mux;
  long lVar9;
  char *pcVar10;
  uint8_t *data;
  uint32_t features;
  WebPData webp_data;
  WebPAnimEncoderOptions anim_config;
  WebPConfig config;
  CommandLineArguments cmd_args;
  WebPPicture pic;
  uint local_264;
  WebPMuxAnimParams local_260;
  uint local_254;
  char *local_250;
  WebPAnimEncoder *local_248;
  ulong local_240;
  uint local_238;
  uint local_234;
  ulong local_230;
  size_t local_228;
  int local_21c;
  WebPData local_218;
  ulong local_200;
  WebPAnimEncoderOptions local_1f8;
  WebPConfig local_1cc;
  CommandLineArguments local_158;
  WebPPicture local_130;
  
  uVar1 = ExUtilInitCommandLineArguments(argc + -1,argv + 1,&local_158);
  if (uVar1 == 0) {
    return 1;
  }
  local_218.bytes = (uint8_t *)0x0;
  local_218.size = 0;
  iVar2 = WebPAnimEncoderOptionsInitInternal(&local_1f8,0x109);
  if (((iVar2 == 0) ||
      (iVar2 = WebPConfigInitInternal(&local_1cc,WEBP_PRESET_DEFAULT,75.0,0x210), iVar2 == 0)) ||
     (iVar2 = WebPPictureInitInternal(&local_130,0x210), iVar2 == 0)) {
    main_cold_4();
    local_248 = (WebPAnimEncoder *)0x0;
    local_240 = 0;
    local_264 = 0;
    pcVar10 = (char *)0x0;
LAB_001043b4:
    iVar2 = 0;
  }
  else {
    local_240 = 0;
    if (local_158.argc_ < 1) {
      local_264 = 0;
      local_250 = (char *)0x0;
    }
    else {
      local_230 = 0;
      iVar2 = 0;
      local_264 = 0;
      local_21c = 0;
      local_250 = (char *)0x0;
      local_248 = (WebPAnimEncoder *)(ulong)uVar1;
      do {
        lVar9 = (long)iVar2;
        pcVar10 = local_158.argv_[lVar9];
        if (*pcVar10 != '-') {
          iVar2 = iVar2 + 1;
          lVar9 = (long)iVar2 + -1;
          do {
            if (local_158.argc_ <= iVar2) goto LAB_00103dfd;
            pcVar10 = local_158.argv_[lVar9 + 1];
            lVar9 = lVar9 + 1;
            iVar2 = iVar2 + 1;
          } while (*pcVar10 != '-');
          local_230 = 1;
          iVar2 = (int)lVar9;
        }
        local_260 = (WebPMuxAnimParams)((ulong)local_260 & 0xffffffff00000000);
        if (((*pcVar10 == '-') && (pcVar10[1] == 'o')) &&
           ((pcVar10[2] == '\0' && (iVar3 = iVar2 + 1, iVar3 < local_158.argc_)))) {
          local_158.argv_[lVar9] = (char *)0x0;
          local_250 = local_158.argv_[iVar3];
          iVar2 = iVar3;
LAB_00103d8c:
          if (local_260.bgcolor != 0) {
            iVar2 = 0;
LAB_0010423f:
            local_248 = (WebPAnimEncoder *)0x0;
            local_240 = 0;
            pcVar10 = local_250;
            goto LAB_001043b7;
          }
          local_158.argv_[iVar2] = (char *)0x0;
          local_248 = (WebPAnimEncoder *)0x1;
        }
        else {
          local_254 = CONCAT31(local_254._1_3_,*pcVar10);
          iVar3 = strcmp(pcVar10,"-kmin");
          if ((iVar3 == 0) && (iVar3 = iVar2 + 1, iVar3 < local_158.argc_)) {
            local_158.argv_[lVar9] = (char *)0x0;
            local_1f8.kmin = ExUtilGetInt(local_158.argv_[iVar3],0,(int *)&local_260);
            iVar2 = iVar3;
            goto LAB_00103d8c;
          }
          iVar3 = strcmp(pcVar10,"-kmax");
          if ((iVar3 == 0) && (iVar3 = iVar2 + 1, iVar3 < local_158.argc_)) {
            local_158.argv_[lVar9] = (char *)0x0;
            local_1f8.kmax = ExUtilGetInt(local_158.argv_[iVar3],0,(int *)&local_260);
            iVar2 = iVar3;
            goto LAB_00103d8c;
          }
          iVar3 = strcmp(pcVar10,"-loop");
          if ((iVar3 == 0) && (iVar3 = iVar2 + 1, iVar3 < local_158.argc_)) {
            local_158.argv_[lVar9] = (char *)0x0;
            local_264 = ExUtilGetInt(local_158.argv_[iVar3],0,(int *)&local_260);
            iVar2 = iVar3;
            if (-1 < (int)local_264) goto LAB_00103d8c;
            iVar2 = 0;
            fprintf(stderr,"Invalid non-positive loop-count (%d)\n",(ulong)local_264);
            goto LAB_0010423f;
          }
          iVar3 = strcmp(pcVar10,"-min_size");
          if (iVar3 == 0) {
            local_1f8.minimize_size = 1;
            goto LAB_00103d8c;
          }
          iVar3 = strcmp(pcVar10,"-mixed");
          if (iVar3 == 0) {
            local_1f8.allow_mixed = 1;
            local_1cc.lossless = 0;
            goto LAB_00103d8c;
          }
          iVar3 = strcmp(pcVar10,"-near_lossless");
          if ((iVar3 == 0) && (iVar3 = iVar2 + 1, iVar3 < local_158.argc_)) {
            local_158.argv_[lVar9] = (char *)0x0;
            local_1cc.near_lossless = ExUtilGetInt(local_158.argv_[iVar3],0,(int *)&local_260);
            iVar2 = iVar3;
            goto LAB_00103d8c;
          }
          iVar3 = strcmp(pcVar10,"-sharp_yuv");
          if (iVar3 == 0) {
            local_1cc.use_sharp_yuv = 1;
            goto LAB_00103d8c;
          }
          if ((char)local_254 == '-') {
            if ((pcVar10[1] == 'v') && (pcVar10[2] == '\0')) {
              local_21c = 1;
              goto LAB_00103d8c;
            }
            if ((pcVar10[1] == 'h') && (pcVar10[2] == '\0')) goto LAB_001042ab;
          }
          iVar3 = strcmp(pcVar10,"-help");
          if (iVar3 == 0) {
LAB_001042ab:
            Help();
            return 0;
          }
          iVar3 = strcmp(pcVar10,"-version");
          if (iVar3 == 0) {
            uVar1 = WebPGetEncoderVersion();
            uVar4 = WebPGetMuxVersion();
            uVar5 = SharpYuvGetVersion();
            printf("WebP Encoder version: %d.%d.%d\nWebP Mux version: %d.%d.%d\n",
                   (ulong)(uVar1 >> 0x10 & 0xff),(ulong)(uVar1 >> 8 & 0xff),(ulong)(uVar1 & 0xff),
                   (ulong)(uVar4 >> 0x10 & 0xff),(ulong)(uVar4 >> 8 & 0xff),uVar4 & 0xff);
            printf("libsharpyuv: %d.%d.%d\n",(ulong)(uVar5 >> 0x18),(ulong)(uVar5 >> 0x10),
                   (ulong)(uVar5 & 0xff));
            iVar2 = (int)local_248;
            goto LAB_0010423f;
          }
        }
        iVar2 = iVar2 + 1;
      } while (iVar2 < local_158.argc_);
      if ((uint)local_230 != 0) {
LAB_00103dfd:
        local_1cc.lossless = 1;
        if (local_158.argc_ < 1) {
          local_248 = (WebPAnimEncoder *)0x0;
          local_240 = 0;
          local_254 = 0;
          local_200 = 0;
        }
        else {
          local_238 = 100;
          local_200 = 0;
          uVar1 = 0;
          local_234 = 0;
          local_230 = local_230 & 0xffffffff00000000;
          local_254 = 0;
          local_240 = 0;
          local_248 = (WebPAnimEncoder *)0x0;
          do {
            pcVar10 = local_158.argv_[(int)uVar1];
            if (pcVar10 != (char *)0x0) {
              if (*pcVar10 != '-') {
                iVar2 = WebPValidateConfig(&local_1cc);
                if (iVar2 == 0) {
                  main_cold_2();
                }
                else {
                  local_130.use_argb = 1;
                  local_260.bgcolor = 0;
                  local_260.loop_count = 0;
                  local_228 = 0;
                  iVar2 = ImgIoUtilReadFile(local_158.argv_[(int)uVar1],(uint8_t **)&local_260,
                                            &local_228);
                  if (iVar2 != 0) {
                    p_Var7 = WebPGuessImageReader((uint8_t *)local_260,local_228);
                    iVar2 = (*p_Var7)((uint8_t *)local_260,local_228,&local_130,1,(Metadata *)0x0);
                    WebPFree((void *)local_260);
                    pcVar10 = local_250;
                    if (iVar2 != 0) {
                      pWVar8 = local_248;
                      if (local_248 == (WebPAnimEncoder *)0x0) {
                        local_230 = CONCAT44(local_230._4_4_,local_130.width);
                        local_234 = local_130.height;
                        pWVar8 = WebPAnimEncoderNewInternal
                                           (local_130.width,local_130.height,&local_1f8,0x109);
                        if (pWVar8 != (WebPAnimEncoder *)0x0) goto LAB_00103fc1;
                        main_cold_1();
                        local_248 = (WebPAnimEncoder *)0x0;
                      }
                      else {
LAB_00103fc1:
                        local_248 = pWVar8;
                        if (((uint)local_230 == local_130.width) && (local_234 == local_130.height))
                        {
                          iVar2 = WebPAnimEncoderAdd(pWVar8,&local_130,local_254,&local_1cc);
                          if (iVar2 != 0) {
                            WebPPictureFree(&local_130);
                            if (local_21c != 0) {
                              fprintf(stderr,"Added frame #%3d at time %4d (file: %s)\n",local_240,
                                      (ulong)local_254);
                            }
                            local_254 = local_254 + local_238;
                            local_240 = (ulong)((int)local_240 + 1);
                            local_200 = (ulong)uVar1;
                            goto LAB_00104139;
                          }
                          fprintf(stderr,"Error while adding frame #%d\n",local_240);
                        }
                        else {
                          fprintf(stderr,
                                  "Frame #%d dimension mismatched! Got %d x %d. Was expecting %d x %d.\n"
                                  ,local_240,(ulong)(uint)local_130.width,
                                  (ulong)(uint)local_130.height,local_230 & 0xffffffff,local_234);
                        }
                      }
                      WebPPictureFree(&local_130);
                      pcVar10 = local_250;
                    }
                    goto LAB_001043b4;
                  }
                }
                goto LAB_0010429a;
              }
              local_260 = (WebPMuxAnimParams)((ulong)local_260 & 0xffffffff00000000);
              iVar2 = strcmp(pcVar10,"-lossy");
              if (iVar2 == 0) {
                if (local_1f8.allow_mixed == 0) {
                  local_1cc.lossless = 0;
                }
              }
              else {
                iVar2 = strcmp(pcVar10,"-lossless");
                if (iVar2 == 0) {
                  if (local_1f8.allow_mixed == 0) {
                    local_1cc.lossless = 1;
                  }
                }
                else if (*pcVar10 == '-') {
                  if (((pcVar10[1] == 'q') && (pcVar10[2] == '\0')) &&
                     ((int)(uVar1 + 1) < local_158.argc_)) {
                    local_1cc.quality =
                         ExUtilGetFloat(local_158.argv_[(int)(uVar1 + 1)],(int *)&local_260);
                  }
                  else {
                    if (((pcVar10[1] != 'm') || (pcVar10[2] != '\0')) ||
                       (local_158.argc_ <= (int)(uVar1 + 1))) {
                      if (((pcVar10[1] != 'd') || (pcVar10[2] != '\0')) ||
                         (uVar4 = uVar1 + 1, local_158.argc_ <= (int)uVar4)) goto LAB_001040ed;
                      local_238 = ExUtilGetInt(local_158.argv_[(int)uVar4],0,(int *)&local_260);
                      uVar1 = uVar4;
                      if (0 < (int)local_238) goto LAB_0010412e;
                      iVar2 = 0;
                      fprintf(stderr,"Invalid negative duration (%d)\n",(ulong)local_238);
                      pcVar10 = local_250;
                      goto LAB_001043b7;
                    }
                    local_1cc.method =
                         ExUtilGetInt(local_158.argv_[(int)(uVar1 + 1)],0,(int *)&local_260);
                  }
                  uVar1 = uVar1 + 1;
                }
                else {
LAB_001040ed:
                  iVar2 = strcmp(pcVar10,"-exact");
                  if (iVar2 == 0) {
                    local_1cc.exact = 1;
                  }
                  else {
                    iVar2 = strcmp(pcVar10,"-noexact");
                    if (iVar2 == 0) {
                      local_1cc.exact = 0;
                    }
                    else {
                      local_260.bgcolor = 1;
                      fprintf(stderr,"Unknown option [%s]\n",pcVar10);
                    }
                  }
                }
              }
LAB_0010412e:
              if (local_260.bgcolor != 0) goto LAB_0010429a;
            }
LAB_00104139:
            uVar1 = uVar1 + 1;
          } while ((int)uVar1 < local_158.argc_);
        }
        if ((int)local_200 + 1 < local_158.argc_) {
          lVar9 = (long)(int)local_200;
          do {
            if (local_158.argv_[lVar9 + 1] != (char *)0x0) {
              fprintf(stderr,
                      "Warning: unused option [%s]! Frame options go before the input frame.\n");
            }
            lVar9 = lVar9 + 1;
          } while (local_158.argc_ + -1 != (int)lVar9);
        }
        pWVar8 = local_248;
        iVar2 = 0;
        iVar3 = WebPAnimEncoderAdd(local_248,(WebPPicture *)0x0,local_254,(WebPConfig *)0x0);
        if ((iVar3 == 0) || (iVar3 = WebPAnimEncoderAssemble(pWVar8,&local_218), iVar3 == 0)) {
          main_cold_3();
          pcVar10 = local_250;
        }
        else {
          iVar2 = 1;
          pcVar10 = local_250;
        }
        goto LAB_001043b7;
      }
    }
    fwrite("No input file(s) for generating animation!\n",0x2b,1,stderr);
    Help();
    local_248 = (WebPAnimEncoder *)0x0;
LAB_0010429a:
    iVar2 = 0;
    pcVar10 = local_250;
  }
LAB_001043b7:
  WebPAnimEncoderDelete(local_248);
  if ((iVar2 != 0) && (0 < (int)local_264)) {
    mux = WebPMuxCreateInternal(&local_218,1,0x109);
    iVar2 = 0;
    if (mux != (WebPMux *)0x0) {
      WVar6 = WebPMuxGetFeatures(mux,(uint32_t *)&local_228);
      if (WVar6 != WEBP_MUX_OK) goto LAB_0010447b;
      if ((local_228 & 2) == 0) {
        WebPMuxDelete(mux);
        iVar2 = 1;
        goto LAB_0010448b;
      }
      WVar6 = WebPMuxGetAnimationParams(mux,&local_260);
      if (WVar6 == WEBP_MUX_OK) {
        local_260.loop_count = local_264;
        WVar6 = WebPMuxSetAnimationParams(mux,&local_260);
        if (WVar6 != WEBP_MUX_OK) goto LAB_0010447b;
        WebPFree(local_218.bytes);
        local_218.bytes = (uint8_t *)0x0;
        local_218.size = 0;
        WVar6 = WebPMuxAssemble(mux,&local_218);
        WebPMuxDelete(mux);
        iVar2 = 1;
        if (WVar6 == WEBP_MUX_OK) goto LAB_0010448b;
      }
      else {
LAB_0010447b:
        WebPMuxDelete(mux);
      }
      main_cold_5();
      iVar2 = 0;
    }
  }
LAB_0010448b:
  iVar3 = 1;
  if (iVar2 != 0) {
    if (pcVar10 == (char *)0x0) {
      main_cold_6();
    }
    else {
      iVar2 = ImgIoUtilWriteFile(pcVar10,local_218.bytes,local_218.size);
      if (iVar2 == 0) goto LAB_001044b0;
      fprintf(stderr,"output file: %s     ",pcVar10);
    }
    iVar3 = 0;
    fprintf(stderr,"[%d frames, %u bytes].\n",local_240,local_218.size & 0xffffffff);
  }
LAB_001044b0:
  WebPFree(local_218.bytes);
  local_218.bytes = (uint8_t *)0x0;
  local_218.size = 0;
  ExUtilDeleteCommandLineArguments(&local_158);
  return iVar3;
}

Assistant:

int main(int argc, const char* argv[]) {
  const char* output = NULL;
  WebPAnimEncoder* enc = NULL;
  int verbose = 0;
  int pic_num = 0;
  int duration = 100;
  int timestamp_ms = 0;
  int loop_count = 0;
  int width = 0, height = 0;
  WebPAnimEncoderOptions anim_config;
  WebPConfig config;
  WebPPicture pic;
  WebPData webp_data;
  int c;
  int have_input = 0;
  int last_input_index = 0;
  CommandLineArguments cmd_args;
  int ok;

  INIT_WARGV(argc, argv);

  ok = ExUtilInitCommandLineArguments(argc - 1, argv + 1, &cmd_args);
  if (!ok) FREE_WARGV_AND_RETURN(EXIT_FAILURE);

  argc = cmd_args.argc_;
  argv = cmd_args.argv_;

  WebPDataInit(&webp_data);
  if (!WebPAnimEncoderOptionsInit(&anim_config) ||
      !WebPConfigInit(&config) ||
      !WebPPictureInit(&pic)) {
    fprintf(stderr, "Library version mismatch!\n");
    ok = 0;
    goto End;
  }

  // 1st pass of option parsing
  for (c = 0; ok && c < argc; ++c) {
    if (argv[c][0] == '-') {
      int parse_error = 0;
      if (!strcmp(argv[c], "-o") && c + 1 < argc) {
        argv[c] = NULL;
        output = (const char*)GET_WARGV_SHIFTED(argv, ++c);
      } else if (!strcmp(argv[c], "-kmin") && c + 1 < argc) {
        argv[c] = NULL;
        anim_config.kmin = ExUtilGetInt(argv[++c], 0, &parse_error);
      } else if (!strcmp(argv[c], "-kmax") && c + 1 < argc) {
        argv[c] = NULL;
        anim_config.kmax = ExUtilGetInt(argv[++c], 0, &parse_error);
      } else if (!strcmp(argv[c], "-loop") && c + 1 < argc) {
        argv[c] = NULL;
        loop_count = ExUtilGetInt(argv[++c], 0, &parse_error);
        if (loop_count < 0) {
          fprintf(stderr, "Invalid non-positive loop-count (%d)\n", loop_count);
          parse_error = 1;
        }
      } else if (!strcmp(argv[c], "-min_size")) {
        anim_config.minimize_size = 1;
      } else if (!strcmp(argv[c], "-mixed")) {
        anim_config.allow_mixed = 1;
        config.lossless = 0;
      } else if (!strcmp(argv[c], "-near_lossless") && c + 1 < argc) {
        argv[c] = NULL;
        config.near_lossless = ExUtilGetInt(argv[++c], 0, &parse_error);
      } else if (!strcmp(argv[c], "-sharp_yuv")) {
        config.use_sharp_yuv = 1;
      } else if (!strcmp(argv[c], "-v")) {
        verbose = 1;
      } else if (!strcmp(argv[c], "-h") || !strcmp(argv[c], "-help")) {
        Help();
        FREE_WARGV_AND_RETURN(EXIT_SUCCESS);
      } else if (!strcmp(argv[c], "-version")) {
        const int enc_version = WebPGetEncoderVersion();
        const int mux_version = WebPGetMuxVersion();
        const int sharpyuv_version = SharpYuvGetVersion();
        printf("WebP Encoder version: %d.%d.%d\nWebP Mux version: %d.%d.%d\n",
               (enc_version >> 16) & 0xff, (enc_version >> 8) & 0xff,
               enc_version & 0xff, (mux_version >> 16) & 0xff,
               (mux_version >> 8) & 0xff, mux_version & 0xff);
        printf("libsharpyuv: %d.%d.%d\n", (sharpyuv_version >> 24) & 0xff,
               (sharpyuv_version >> 16) & 0xffff, sharpyuv_version & 0xff);
        goto End;
      } else {
        continue;
      }
      ok = !parse_error;
      if (!ok) goto End;
      argv[c] = NULL;   // mark option as 'parsed' during 1st pass
    } else {
      have_input |= 1;
    }
  }
  if (!have_input) {
    fprintf(stderr, "No input file(s) for generating animation!\n");
    ok = 0;
    Help();
    goto End;
  }

  // image-reading pass
  pic_num = 0;
  config.lossless = 1;
  for (c = 0; ok && c < argc; ++c) {
    if (argv[c] == NULL) continue;
    if (argv[c][0] == '-') {    // parse local options
      int parse_error = 0;
      if (!strcmp(argv[c], "-lossy")) {
        if (!anim_config.allow_mixed) config.lossless = 0;
      } else if (!strcmp(argv[c], "-lossless")) {
        if (!anim_config.allow_mixed) config.lossless = 1;
      } else if (!strcmp(argv[c], "-q") && c + 1 < argc) {
        config.quality = ExUtilGetFloat(argv[++c], &parse_error);
      } else if (!strcmp(argv[c], "-m") && c + 1 < argc) {
        config.method = ExUtilGetInt(argv[++c], 0, &parse_error);
      } else if (!strcmp(argv[c], "-d") && c + 1 < argc) {
        duration = ExUtilGetInt(argv[++c], 0, &parse_error);
        if (duration <= 0) {
          fprintf(stderr, "Invalid negative duration (%d)\n", duration);
          parse_error = 1;
        }
      } else if (!strcmp(argv[c], "-exact")) {
        config.exact = 1;
      } else if (!strcmp(argv[c], "-noexact")) {
        config.exact = 0;
      } else {
        parse_error = 1;   // shouldn't be here.
        fprintf(stderr, "Unknown option [%s]\n", argv[c]);
      }
      ok = !parse_error;
      if (!ok) goto End;
      continue;
    }

    if (ok) {
      ok = WebPValidateConfig(&config);
      if (!ok) {
        fprintf(stderr, "Invalid configuration.\n");
        goto End;
      }
    }

    // read next input image
    pic.use_argb = 1;
    ok = ReadImage((const char*)GET_WARGV_SHIFTED(argv, c), &pic);
    last_input_index = c;
    if (!ok) goto End;

    if (enc == NULL) {
      width  = pic.width;
      height = pic.height;
      enc = WebPAnimEncoderNew(width, height, &anim_config);
      ok = (enc != NULL);
      if (!ok) {
        fprintf(stderr, "Could not create WebPAnimEncoder object.\n");
      }
    }

    if (ok) {
      ok = (width == pic.width && height == pic.height);
      if (!ok) {
        fprintf(stderr, "Frame #%d dimension mismatched! "
                        "Got %d x %d. Was expecting %d x %d.\n",
                pic_num, pic.width, pic.height, width, height);
      }
    }

    if (ok) {
      ok = WebPAnimEncoderAdd(enc, &pic, timestamp_ms, &config);
      if (!ok) {
        fprintf(stderr, "Error while adding frame #%d\n", pic_num);
      }
    }
    WebPPictureFree(&pic);
    if (!ok) goto End;

    if (verbose) {
      WFPRINTF(stderr, "Added frame #%3d at time %4d (file: %s)\n",
               pic_num, timestamp_ms, GET_WARGV_SHIFTED(argv, c));
    }
    timestamp_ms += duration;
    ++pic_num;
  }

  for (c = last_input_index + 1; c < argc; ++c) {
    if (argv[c] != NULL) {
      fprintf(stderr, "Warning: unused option [%s]!"
                      " Frame options go before the input frame.\n", argv[c]);
    }
  }

  // add a last fake frame to signal the last duration
  ok = ok && WebPAnimEncoderAdd(enc, NULL, timestamp_ms, NULL);
  ok = ok && WebPAnimEncoderAssemble(enc, &webp_data);
  if (!ok) {
    fprintf(stderr, "Error during final animation assembly.\n");
  }

 End:
  // free resources
  WebPAnimEncoderDelete(enc);

  if (ok && loop_count > 0) {  // Re-mux to add loop count.
    ok = SetLoopCount(loop_count, &webp_data);
  }

  if (ok) {
    if (output != NULL) {
      ok = ImgIoUtilWriteFile(output, webp_data.bytes, webp_data.size);
      if (ok) WFPRINTF(stderr, "output file: %s     ", (const W_CHAR*)output);
    } else {
      fprintf(stderr, "[no output file specified]   ");
    }
  }

  if (ok) {
    fprintf(stderr, "[%d frames, %u bytes].\n",
            pic_num, (unsigned int)webp_data.size);
  }
  WebPDataClear(&webp_data);
  ExUtilDeleteCommandLineArguments(&cmd_args);
  FREE_WARGV_AND_RETURN(ok ? EXIT_SUCCESS : EXIT_FAILURE);
}